

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t
av1_create_context_and_bufferpool
          (AV1_PRIMARY *ppi,AV1_COMP **p_cpi,BufferPool **p_buffer_pool,AV1EncoderConfig *oxcf,
          COMPRESSOR_STAGE stage,int lap_lag_in_frames)

{
  undefined1 uVar1;
  int iVar2;
  AV1_COMP *pAVar3;
  pthread_mutex_t *__mutex;
  void *pvVar4;
  size_t num;
  aom_codec_err_t aVar5;
  bool bVar6;
  
  __mutex = (pthread_mutex_t *)*p_buffer_pool;
  if (__mutex == (pthread_mutex_t *)0x0) {
    __mutex = (pthread_mutex_t *)aom_calloc(1,0x60);
    if (__mutex == (pthread_mutex_t *)0x0) {
      return AOM_CODEC_MEM_ERROR;
    }
    bVar6 = oxcf->mode == '\x02';
    aVar5 = AOM_CODEC_MEM_ERROR;
    uVar1 = 0x10;
    if (bVar6) {
      uVar1 = 2;
    }
    *(undefined1 *)((long)__mutex + 0x48) = uVar1;
    num = 0x10;
    if (bVar6) {
      num = 2;
    }
    pvVar4 = aom_calloc(num,0x58e0);
    *(void **)((long)__mutex + 0x40) = pvVar4;
    if (pvVar4 != (void *)0x0) {
      iVar2 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      if (iVar2 == 0) {
        *p_buffer_pool = (BufferPool *)__mutex;
        goto LAB_00179cfd;
      }
      aom_free(*(void **)((long)__mutex + 0x40));
      *(undefined8 *)((long)__mutex + 0x40) = 0;
    }
    *(undefined1 *)((long)__mutex + 0x48) = 0;
    aom_free(__mutex);
  }
  else {
LAB_00179cfd:
    pAVar3 = av1_create_compressor(ppi,oxcf,(BufferPool *)&__mutex->__data,stage,lap_lag_in_frames);
    *p_cpi = pAVar3;
    aVar5 = (uint)(pAVar3 == (AV1_COMP *)0x0) * 2;
  }
  return aVar5;
}

Assistant:

aom_codec_err_t av1_create_context_and_bufferpool(AV1_PRIMARY *ppi,
                                                  AV1_COMP **p_cpi,
                                                  BufferPool **p_buffer_pool,
                                                  const AV1EncoderConfig *oxcf,
                                                  COMPRESSOR_STAGE stage,
                                                  int lap_lag_in_frames) {
  aom_codec_err_t res = AOM_CODEC_OK;
  BufferPool *buffer_pool = *p_buffer_pool;

  if (buffer_pool == NULL) {
    buffer_pool = (BufferPool *)aom_calloc(1, sizeof(BufferPool));
    if (buffer_pool == NULL) return AOM_CODEC_MEM_ERROR;
    buffer_pool->num_frame_bufs =
        (oxcf->mode == ALLINTRA) ? FRAME_BUFFERS_ALLINTRA : FRAME_BUFFERS;
    buffer_pool->frame_bufs = (RefCntBuffer *)aom_calloc(
        buffer_pool->num_frame_bufs, sizeof(*buffer_pool->frame_bufs));
    if (buffer_pool->frame_bufs == NULL) {
      buffer_pool->num_frame_bufs = 0;
      aom_free(buffer_pool);
      return AOM_CODEC_MEM_ERROR;
    }
#if CONFIG_MULTITHREAD
    if (pthread_mutex_init(&buffer_pool->pool_mutex, NULL)) {
      aom_free(buffer_pool->frame_bufs);
      buffer_pool->frame_bufs = NULL;
      buffer_pool->num_frame_bufs = 0;
      aom_free(buffer_pool);
      return AOM_CODEC_MEM_ERROR;
    }
#endif
    *p_buffer_pool = buffer_pool;
  }
  *p_cpi =
      av1_create_compressor(ppi, oxcf, buffer_pool, stage, lap_lag_in_frames);
  if (*p_cpi == NULL) res = AOM_CODEC_MEM_ERROR;

  return res;
}